

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
::
AddConstraintAndTryNoteResultVariable<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
                 *con)

{
  bool bVar1;
  int iVar2;
  int i_00;
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
  *pck;
  BasicCStringRef<char> *this_00;
  FunctionalConstraint *in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  NodeRange NVar3;
  ConInfo ci;
  int i;
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
  *ck;
  int resvar;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff70;
  int d;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  BasicConstraintKeeper *in_stack_ffffffffffffffb8;
  CStringRef in_stack_ffffffffffffffc0;
  
  iVar2 = FunctionalConstraint::GetResultVar(in_RSI);
  pck = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::GetConstraintKeeper(in_RDI,(IfThenConstraint *)0x0);
  d = (int)((ulong)in_RDI >> 0x20);
  i_00 = ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
         ::
         AddConstraint<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
                   ((ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
                     *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),d,
                    (CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
                     *)in_stack_ffffffffffffff70);
  ConstraintLocationHelper<mp::BasicConstraintKeeper>::ConstraintLocationHelper
            ((ConstraintLocationHelper<mp::BasicConstraintKeeper> *)&stack0xffffffffffffffb8,
             &pck->super_BasicConstraintKeeper,i_00);
  if (-1 < iVar2) {
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddInitExpression((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),d,
                        (ConInfo *)in_stack_ffffffffffffff70);
  }
  GetConstraint<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  bVar1 = MapInsert<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
                    (in_stack_ffffffffffffff70,
                     (CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
                      *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  if (!bVar1) {
    this_00 = (BasicCStringRef<char> *)__cxa_allocate_exception(0x18);
    ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
    ::GetDescription_abi_cxx11_
              ((ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
                *)pck);
    std::operator+((char *)in_stack_ffffffffffffffb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    fmt::BasicCStringRef<char>::BasicCStringRef
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Error::Error((Error *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb4);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  NVar3 = BasicConstraintKeeper::SelectValueNodeRange
                    ((BasicConstraintKeeper *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                     in_stack_ffffffffffffff68);
  return NVar3;
}

Assistant:

pre::NodeRange AddConstraintAndTryNoteResultVariable(Constraint&& con) {
    const auto resvar = con.GetResultVar();
    auto& ck = GET_CONSTRAINT_KEEPER( Constraint );
    auto i = ck.AddConstraint(constr_depth_, std::move(con));
    ConInfo ci{&ck, i};
    if (resvar>=0)
      AddInitExpression(resvar, ci);
    /// Can also cache non-functional constraints,
    /// but then implement checking before
    if (! MP_DISPATCH( MapInsert(
                         MPD(template GetConstraint<Constraint>(i)), i ) ))
      MP_RAISE("Trying to MapInsert() duplicated constraint: " +
                             ck.GetDescription());
    return ck.SelectValueNodeRange(i);
  }